

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O0

void __thiscall tst_RootIndexProxyModel::insertColumn(tst_RootIndexProxyModel *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  QAbstractItemModel *parent;
  ModelTest *this_00;
  const_reference pQVar5;
  QModelIndex local_4b8;
  QModelIndex local_4a0;
  QModelIndex local_488;
  value_type local_470;
  qint32 local_454;
  qsizetype local_450;
  QModelIndex local_448;
  QModelIndex local_430;
  QModelIndex local_418;
  value_type local_400;
  qint32 local_3e4;
  qsizetype local_3e0;
  QModelIndex local_3d8;
  QModelIndex local_3c0;
  value_type local_3a8;
  qint32 local_38c;
  qsizetype local_388;
  QModelIndex local_380;
  QModelIndex local_368;
  undefined1 local_350 [8];
  QList<QVariant> arguments;
  qsizetype local_330;
  QModelIndex local_328;
  undefined1 local_310 [24];
  QModelIndex local_2f8;
  QModelIndex local_2e0;
  QModelIndex local_2c8;
  QModelIndex local_2b0;
  undefined1 local_298 [28];
  int local_27c;
  undefined1 local_278 [4];
  int oldColCount;
  QSignalSpy sourceColumnsInsertedSpy;
  QSignalSpy sourceColumnsAboutToBeInsertedSpy;
  QSignalSpy proxyColumnsInsertedSpy;
  undefined1 local_f0 [8];
  QSignalSpy proxyColumnsAboutToBeInsertedSpy;
  undefined1 local_58 [40];
  RootIndexProxyModel local_30 [8];
  RootIndexProxyModel proxyModel;
  QAbstractItemModel *baseModel;
  tst_RootIndexProxyModel *this_local;
  
  parent = createTreeModel(&this->super_QObject);
  RootIndexProxyModel::RootIndexProxyModel(local_30,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)local_30,(QObject *)parent);
  RootIndexProxyModel::setSourceModel((QAbstractItemModel *)local_30);
  QModelIndex::QModelIndex((QModelIndex *)&proxyColumnsAboutToBeInsertedSpy.m_waiting);
  (**(code **)(*(long *)parent + 0x60))
            (local_58,parent,1,0,&proxyColumnsAboutToBeInsertedSpy.m_waiting);
  RootIndexProxyModel::setRootIndex((QModelIndex *)local_30);
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_f0,(QObject *)local_30,
             "2columnsAboutToBeInserted(QModelIndex, int, int)");
  bVar1 = QSignalSpy::isValid((QSignalSpy *)local_f0);
  bVar2 = QTest::qVerify(bVar1,"proxyColumnsAboutToBeInsertedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                         ,0xd0);
  if ((bVar2 & 1) == 0) {
    proxyColumnsInsertedSpy._124_4_ = 1;
  }
  else {
    QSignalSpy::QSignalSpy
              ((QSignalSpy *)&sourceColumnsAboutToBeInsertedSpy.m_waiting,(QObject *)local_30,
               "2columnsInserted(QModelIndex, int, int)");
    bVar1 = QSignalSpy::isValid((QSignalSpy *)&sourceColumnsAboutToBeInsertedSpy.m_waiting);
    bVar2 = QTest::qVerify(bVar1,"proxyColumnsInsertedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                           ,0xd2);
    if ((bVar2 & 1) == 0) {
      proxyColumnsInsertedSpy._124_4_ = 1;
    }
    else {
      QSignalSpy::QSignalSpy
                ((QSignalSpy *)&sourceColumnsInsertedSpy.m_waiting,(QObject *)parent,
                 "2columnsAboutToBeInserted(QModelIndex, int, int)");
      bVar1 = QSignalSpy::isValid((QSignalSpy *)&sourceColumnsInsertedSpy.m_waiting);
      bVar2 = QTest::qVerify(bVar1,"sourceColumnsAboutToBeInsertedSpy.isValid()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                             ,0xd4);
      if ((bVar2 & 1) == 0) {
        proxyColumnsInsertedSpy._124_4_ = 1;
      }
      else {
        QSignalSpy::QSignalSpy
                  ((QSignalSpy *)local_278,(QObject *)parent,
                   "2columnsInserted(QModelIndex, int, int)");
        bVar1 = QSignalSpy::isValid((QSignalSpy *)local_278);
        bVar2 = QTest::qVerify(bVar1,"sourceColumnsInsertedSpy.isValid()","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                               ,0xd6);
        if ((bVar2 & 1) == 0) {
          proxyColumnsInsertedSpy._124_4_ = 1;
        }
        else {
          QModelIndex::QModelIndex(&local_2b0);
          (**(code **)(*(long *)parent + 0x60))(local_298,parent,1,0,&local_2b0);
          iVar3 = (**(code **)(*(long *)parent + 0x80))(parent,local_298);
          local_27c = iVar3;
          QModelIndex::QModelIndex(&local_2c8);
          iVar4 = RootIndexProxyModel::columnCount((QModelIndex *)local_30);
          bVar2 = QTest::qCompare(iVar3,iVar4,"oldColCount","proxyModel.columnCount()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                  ,0xd8);
          if (((bVar2 ^ 0xff) & 1) == 0) {
            QModelIndex::QModelIndex(&local_2e0);
            RootIndexProxyModel::insertColumns((int)local_30,1,(QModelIndex *)0x1);
            iVar3 = local_27c + 1;
            QModelIndex::QModelIndex(&local_2f8);
            iVar4 = RootIndexProxyModel::columnCount((QModelIndex *)local_30);
            bVar2 = QTest::qCompare(iVar3,iVar4,"oldColCount + 1","proxyModel.columnCount()",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                    ,0xda);
            if (((bVar2 ^ 0xff) & 1) == 0) {
              iVar3 = local_27c + 1;
              QModelIndex::QModelIndex(&local_328);
              (**(code **)(*(long *)parent + 0x60))(local_310,parent,1,0,&local_328);
              iVar4 = (**(code **)(*(long *)parent + 0x80))(parent,local_310);
              bVar2 = QTest::qCompare(iVar3,iVar4,"oldColCount + 1",
                                      "baseModel->columnCount(baseModel->index(1, 0))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                      ,0xdb);
              if (((bVar2 ^ 0xff) & 1) == 0) {
                local_330 = QList<QList<QVariant>_>::count
                                      ((QList<QList<QVariant>_> *)
                                       &proxyColumnsAboutToBeInsertedSpy.field_0x8);
                arguments.d.size._4_4_ = 1;
                bVar1 = QTest::qCompare<long_long,int>
                                  (&local_330,(qint32 *)((long)&arguments.d.size + 4),
                                   "proxyColumnsAboutToBeInsertedSpy.count()","1",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                   ,0xdc);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  QList<QList<QVariant>_>::takeFirst
                            ((value_type *)local_350,
                             (QList<QList<QVariant>_> *)&proxyColumnsAboutToBeInsertedSpy.field_0x8)
                  ;
                  pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,0);
                  QVariant::value<QModelIndex>(&local_368,pQVar5);
                  QModelIndex::QModelIndex(&local_380);
                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                    (&local_368,&local_380,"arguments.at(0).value<QModelIndex>()",
                                     "QModelIndex()",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                     ,0xde);
                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                    pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,1);
                    iVar3 = QVariant::value<int>(pQVar5);
                    bVar2 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()","1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                            ,0xdf);
                    if ((bVar2 & 1) == 0) {
                      proxyColumnsInsertedSpy._124_4_ = 1;
                    }
                    else {
                      pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,2);
                      iVar3 = QVariant::value<int>(pQVar5);
                      bVar2 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()","1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                              ,0xe0);
                      if ((bVar2 & 1) == 0) {
                        proxyColumnsInsertedSpy._124_4_ = 1;
                      }
                      else {
                        local_388 = QList<QList<QVariant>_>::count
                                              ((QList<QList<QVariant>_> *)
                                               &proxyColumnsInsertedSpy.field_0x8);
                        local_38c = 1;
                        bVar1 = QTest::qCompare<long_long,int>
                                          (&local_388,&local_38c,"proxyColumnsInsertedSpy.count()",
                                           "1",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                           ,0xe1);
                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                          QList<QList<QVariant>_>::takeFirst
                                    (&local_3a8,
                                     (QList<QList<QVariant>_> *)&proxyColumnsInsertedSpy.field_0x8);
                          QList<QVariant>::operator=((QList<QVariant> *)local_350,&local_3a8);
                          QList<QVariant>::~QList(&local_3a8);
                          pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,0);
                          QVariant::value<QModelIndex>(&local_3c0,pQVar5);
                          QModelIndex::QModelIndex(&local_3d8);
                          bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                            (&local_3c0,&local_3d8,
                                             "arguments.at(0).value<QModelIndex>()","QModelIndex()",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                             ,0xe3);
                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                            pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,1);
                            iVar3 = QVariant::value<int>(pQVar5);
                            bVar2 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()","1",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xe4);
                            if ((bVar2 & 1) == 0) {
                              proxyColumnsInsertedSpy._124_4_ = 1;
                            }
                            else {
                              pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,2);
                              iVar3 = QVariant::value<int>(pQVar5);
                              bVar2 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()","1",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xe5);
                              if ((bVar2 & 1) == 0) {
                                proxyColumnsInsertedSpy._124_4_ = 1;
                              }
                              else {
                                local_3e0 = QList<QList<QVariant>_>::count
                                                      ((QList<QList<QVariant>_> *)
                                                       &sourceColumnsAboutToBeInsertedSpy.field_0x8)
                                ;
                                local_3e4 = 1;
                                bVar1 = QTest::qCompare<long_long,int>
                                                  (&local_3e0,&local_3e4,
                                                   "sourceColumnsAboutToBeInsertedSpy.count()","1",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xe6);
                                if (((bVar1 ^ 0xffU) & 1) == 0) {
                                  QList<QList<QVariant>_>::takeFirst
                                            (&local_400,
                                             (QList<QList<QVariant>_> *)
                                             &sourceColumnsAboutToBeInsertedSpy.field_0x8);
                                  QList<QVariant>::operator=
                                            ((QList<QVariant> *)local_350,&local_400);
                                  QList<QVariant>::~QList(&local_400);
                                  pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,0);
                                  QVariant::value<QModelIndex>(&local_418,pQVar5);
                                  QModelIndex::QModelIndex(&local_448);
                                  (**(code **)(*(long *)parent + 0x60))
                                            (&local_430,parent,1,0,&local_448);
                                  bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                    (&local_418,&local_430,
                                                     "arguments.at(0).value<QModelIndex>()",
                                                     "baseModel->index(1, 0)",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xe8);
                                  if (((bVar1 ^ 0xffU) & 1) == 0) {
                                    pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,1);
                                    iVar3 = QVariant::value<int>(pQVar5);
                                    bVar2 = QTest::qCompare(iVar3,1,"arguments.at(1).value<int>()",
                                                            "1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xe9);
                                    if ((bVar2 & 1) == 0) {
                                      proxyColumnsInsertedSpy._124_4_ = 1;
                                    }
                                    else {
                                      pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,2);
                                      iVar3 = QVariant::value<int>(pQVar5);
                                      bVar2 = QTest::qCompare(iVar3,1,"arguments.at(2).value<int>()"
                                                              ,"1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xea);
                                      if ((bVar2 & 1) == 0) {
                                        proxyColumnsInsertedSpy._124_4_ = 1;
                                      }
                                      else {
                                        local_450 = QList<QList<QVariant>_>::count
                                                              ((QList<QList<QVariant>_> *)
                                                               &sourceColumnsInsertedSpy.field_0x8);
                                        local_454 = 1;
                                        bVar1 = QTest::qCompare<long_long,int>
                                                          (&local_450,&local_454,
                                                           "sourceColumnsInsertedSpy.count()","1",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xeb);
                                        if (((bVar1 ^ 0xffU) & 1) == 0) {
                                          QList<QList<QVariant>_>::takeFirst
                                                    (&local_470,
                                                     (QList<QList<QVariant>_> *)
                                                     &sourceColumnsInsertedSpy.field_0x8);
                                          QList<QVariant>::operator=
                                                    ((QList<QVariant> *)local_350,&local_470);
                                          QList<QVariant>::~QList(&local_470);
                                          pQVar5 = QList<QVariant>::at((QList<QVariant> *)local_350,
                                                                       0);
                                          QVariant::value<QModelIndex>(&local_488,pQVar5);
                                          QModelIndex::QModelIndex(&local_4b8);
                                          (**(code **)(*(long *)parent + 0x60))
                                                    (&local_4a0,parent,1,0,&local_4b8);
                                          bVar1 = QTest::qCompare<QModelIndex,QModelIndex>
                                                            (&local_488,&local_4a0,
                                                             "arguments.at(0).value<QModelIndex>()",
                                                             "baseModel->index(1, 0)",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xed);
                                          if (((bVar1 ^ 0xffU) & 1) == 0) {
                                            pQVar5 = QList<QVariant>::at((QList<QVariant> *)
                                                                         local_350,1);
                                            iVar3 = QVariant::value<int>(pQVar5);
                                            bVar2 = QTest::qCompare(iVar3,1,
                                                  "arguments.at(1).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xee);
                                            if ((bVar2 & 1) == 0) {
                                              proxyColumnsInsertedSpy._124_4_ = 1;
                                            }
                                            else {
                                              pQVar5 = QList<QVariant>::at((QList<QVariant> *)
                                                                           local_350,2);
                                              iVar3 = QVariant::value<int>(pQVar5);
                                              bVar2 = QTest::qCompare(iVar3,1,
                                                  "arguments.at(2).value<int>()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0xef);
                                              if ((bVar2 & 1) == 0) {
                                                proxyColumnsInsertedSpy._124_4_ = 1;
                                              }
                                              else {
                                                QObject::deleteLater();
                                                proxyColumnsInsertedSpy._124_4_ = 0;
                                              }
                                            }
                                          }
                                          else {
                                            proxyColumnsInsertedSpy._124_4_ = 1;
                                          }
                                        }
                                        else {
                                          proxyColumnsInsertedSpy._124_4_ = 1;
                                        }
                                      }
                                    }
                                  }
                                  else {
                                    proxyColumnsInsertedSpy._124_4_ = 1;
                                  }
                                }
                                else {
                                  proxyColumnsInsertedSpy._124_4_ = 1;
                                }
                              }
                            }
                          }
                          else {
                            proxyColumnsInsertedSpy._124_4_ = 1;
                          }
                        }
                        else {
                          proxyColumnsInsertedSpy._124_4_ = 1;
                        }
                      }
                    }
                  }
                  else {
                    proxyColumnsInsertedSpy._124_4_ = 1;
                  }
                  QList<QVariant>::~QList((QList<QVariant> *)local_350);
                }
                else {
                  proxyColumnsInsertedSpy._124_4_ = 1;
                }
              }
              else {
                proxyColumnsInsertedSpy._124_4_ = 1;
              }
            }
            else {
              proxyColumnsInsertedSpy._124_4_ = 1;
            }
          }
          else {
            proxyColumnsInsertedSpy._124_4_ = 1;
          }
        }
        QSignalSpy::~QSignalSpy((QSignalSpy *)local_278);
      }
      QSignalSpy::~QSignalSpy((QSignalSpy *)&sourceColumnsInsertedSpy.m_waiting);
    }
    QSignalSpy::~QSignalSpy((QSignalSpy *)&sourceColumnsAboutToBeInsertedSpy.m_waiting);
  }
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_f0);
  RootIndexProxyModel::~RootIndexProxyModel(local_30);
  return;
}

Assistant:

void tst_RootIndexProxyModel::insertColumn()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QAbstractItemModel *baseModel = createTreeModel(this);
    RootIndexProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setSourceModel(baseModel);
    proxyModel.setRootIndex(baseModel->index(1, 0));
    QSignalSpy proxyColumnsAboutToBeInsertedSpy(&proxyModel, SIGNAL(columnsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxyColumnsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxyColumnsInsertedSpy(&proxyModel, SIGNAL(columnsInserted(QModelIndex, int, int)));
    QVERIFY(proxyColumnsInsertedSpy.isValid());
    QSignalSpy sourceColumnsAboutToBeInsertedSpy(baseModel, SIGNAL(columnsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(sourceColumnsAboutToBeInsertedSpy.isValid());
    QSignalSpy sourceColumnsInsertedSpy(baseModel, SIGNAL(columnsInserted(QModelIndex, int, int)));
    QVERIFY(sourceColumnsInsertedSpy.isValid());
    int oldColCount = baseModel->columnCount(baseModel->index(1, 0));
    QCOMPARE(oldColCount, proxyModel.columnCount());
    proxyModel.insertColumns(1, 1);
    QCOMPARE(oldColCount + 1, proxyModel.columnCount());
    QCOMPARE(oldColCount + 1, baseModel->columnCount(baseModel->index(1, 0)));
    QCOMPARE(proxyColumnsAboutToBeInsertedSpy.count(), 1);
    QList<QVariant> arguments = proxyColumnsAboutToBeInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(proxyColumnsInsertedSpy.count(), 1);
    arguments = proxyColumnsInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), QModelIndex());
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceColumnsAboutToBeInsertedSpy.count(), 1);
    arguments = sourceColumnsAboutToBeInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    QCOMPARE(sourceColumnsInsertedSpy.count(), 1);
    arguments = sourceColumnsInsertedSpy.takeFirst();
    QCOMPARE(arguments.at(0).value<QModelIndex>(), baseModel->index(1, 0));
    QCOMPARE(arguments.at(1).value<int>(), 1);
    QCOMPARE(arguments.at(2).value<int>(), 1);
    baseModel->deleteLater();
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}